

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnV128ConstExpr(BinaryReaderIR *this,v128 value_bits)

{
  Result RVar1;
  Location *in_R8;
  v128 val;
  Location local_b0;
  Const *local_90;
  uint8_t local_88 [8];
  Const local_80;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_38;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_30;
  BinaryReaderIR *local_28;
  BinaryReaderIR *this_local;
  v128 value_bits_local;
  
  local_88 = value_bits.v._8_8_;
  local_90 = value_bits.v._0_8_;
  local_28 = this;
  unique0x100000df = local_90;
  value_bits_local.v._0_8_ = local_88;
  GetLocation(&local_b0,this);
  val.v._8_8_ = &local_b0;
  val.v[0] = local_88[0];
  val.v[1] = local_88[1];
  val.v[2] = local_88[2];
  val.v[3] = local_88[3];
  val.v[4] = local_88[4];
  val.v[5] = local_88[5];
  val.v[6] = local_88[6];
  val.v[7] = local_88[7];
  Const::V128(&local_80,local_90,val,in_R8);
  MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_38,&local_80);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_30,&local_38);
  value_bits_local.v._8_4_ = AppendExpr(this,&local_30);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_30);
  std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr(&local_38);
  RVar1.enum_._0_1_ = value_bits_local.v[8];
  RVar1.enum_._1_1_ = value_bits_local.v[9];
  RVar1.enum_._2_1_ = value_bits_local.v[10];
  RVar1.enum_._3_1_ = value_bits_local.v[0xb];
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnV128ConstExpr(v128 value_bits) {
  return AppendExpr(
      MakeUnique<ConstExpr>(Const::V128(value_bits, GetLocation())));
}